

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O3

void __thiscall hgdb::json::SymbolTable::ScopeVisitor::visit(ScopeVisitor *this,ScopeBase *scope)

{
  undefined8 *puVar1;
  long lVar2;
  _func_int **pp_Var3;
  Module *__range4;
  unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_> *ss;
  undefined8 *puVar4;
  
  if (scope == (ScopeBase *)0x0) {
    return;
  }
  lVar2 = __dynamic_cast(scope,&ScopeBase::typeinfo,&Module::typeinfo,0);
  if (lVar2 == 0) {
    lVar2 = __dynamic_cast(scope,&ScopeBase::typeinfo,&VarStmt::typeinfo,0);
    if (lVar2 == 0) {
      lVar2 = __dynamic_cast(scope,&ScopeBase::typeinfo,&Scope<decltype(nullptr)>::typeinfo,0);
      if (lVar2 == 0) {
        return;
      }
      puVar1 = *(undefined8 **)(lVar2 + 0x18);
      for (puVar4 = *(undefined8 **)(lVar2 + 0x10); puVar4 != puVar1; puVar4 = puVar4 + 1) {
        visit(this,(ScopeBase *)*puVar4);
      }
      pp_Var3 = this->_vptr_ScopeVisitor + 2;
    }
    else {
      pp_Var3 = this->_vptr_ScopeVisitor + 1;
    }
  }
  else {
    puVar1 = *(undefined8 **)(lVar2 + 0x18);
    for (puVar4 = *(undefined8 **)(lVar2 + 0x10); puVar4 != puVar1; puVar4 = puVar4 + 1) {
      visit(this,(ScopeBase *)*puVar4);
    }
    pp_Var3 = this->_vptr_ScopeVisitor;
  }
  (**pp_Var3)(this,lVar2);
  return;
}

Assistant:

void visit(ScopeBase *scope) {
            if (auto *m = dynamic_cast<Module *>(scope)) {
                for (auto const &ss : *m) {
                    visit(ss.get());
                }
                handle(m);
            } else if (auto *v = dynamic_cast<VarStmt *>(scope)) {
                handle(v);
            } else if (auto *s = dynamic_cast<Scope<> *>(scope)) {
                for (auto const &ss : *s) {
                    visit(ss.get());
                }
                handle(s);
            }
        }